

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorImpl<char>::swap(SmallVectorImpl<char> *this,SmallVectorImpl<char> *RHS)

{
  undefined1 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  SmallVectorImpl<char> *pSVar5;
  SmallVectorImpl<char> *pSVar6;
  void *pvVar7;
  void *pvVar8;
  void *__tmp;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (this != RHS) {
    pSVar5 = (SmallVectorImpl<char> *)
             (this->super_SmallVectorTemplateBase<char,_true>).
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    if ((pSVar5 == this + 1) ||
       (pSVar6 = (SmallVectorImpl<char> *)
                 (RHS->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
       pSVar6 == RHS + 1)) {
      uVar2 = (RHS->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      if ((this->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar2) {
        SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,(ulong)uVar2,1);
      }
      uVar2 = (this->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      if ((RHS->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar2) {
        SmallVectorBase::grow_pod((SmallVectorBase *)RHS,RHS + 1,(ulong)uVar2,1);
      }
      uVar2 = (this->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      uVar3 = (RHS->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      if (uVar2 < uVar3) {
        uVar3 = uVar2;
      }
      uVar11 = (ulong)uVar3;
      if (uVar3 != 0) {
        uVar9 = 0;
        do {
          if (((this->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size <= uVar9) ||
             ((RHS->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size <= uVar9)) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                          ,0x95,
                          "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                         );
          }
          pvVar7 = (this->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          pvVar8 = (RHS->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          uVar1 = *(undefined1 *)((long)pvVar7 + uVar9);
          *(undefined1 *)((long)pvVar7 + uVar9) = *(undefined1 *)((long)pvVar8 + uVar9);
          *(undefined1 *)((long)pvVar8 + uVar9) = uVar1;
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      }
      uVar2 = (this->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      uVar10 = (ulong)uVar2;
      uVar4 = (RHS->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      uVar9 = (ulong)uVar4;
      if (uVar4 < uVar2) {
        if (uVar3 != uVar2) {
          memcpy((void *)(uVar9 + (long)(RHS->super_SmallVectorTemplateBase<char,_true>).
                                        super_SmallVectorTemplateCommon<char,_void>.
                                        super_SmallVectorBase.BeginX),
                 (void *)((long)(this->super_SmallVectorTemplateBase<char,_true>).
                                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                BeginX + uVar11),uVar10 - uVar11);
        }
        uVar11 = (uVar10 - uVar9) +
                 (ulong)(RHS->super_SmallVectorTemplateBase<char,_true>).
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        if (((RHS->super_SmallVectorTemplateBase<char,_true>).
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar11) ||
           ((RHS->super_SmallVectorTemplateBase<char,_true>).
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = (uint)uVar11,
           (this->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar3)) {
LAB_00b373b8:
          __assert_fail("N <= capacity()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                        ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
        }
        (this->super_SmallVectorTemplateBase<char,_true>).
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = uVar3;
      }
      else if (uVar2 < uVar4) {
        if (uVar3 != uVar4) {
          memcpy((void *)(uVar10 + (long)(this->super_SmallVectorTemplateBase<char,_true>).
                                         super_SmallVectorTemplateCommon<char,_void>.
                                         super_SmallVectorBase.BeginX),
                 (void *)((long)(RHS->super_SmallVectorTemplateBase<char,_true>).
                                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                BeginX + uVar11),uVar9 - uVar11);
        }
        uVar11 = (uVar9 - uVar10) +
                 (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        if (((this->super_SmallVectorTemplateBase<char,_true>).
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar11) ||
           ((this->super_SmallVectorTemplateBase<char,_true>).
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = (uint)uVar11,
           (RHS->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar3))
        goto LAB_00b373b8;
        (RHS->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>
        .super_SmallVectorBase.Size = uVar3;
      }
    }
    else {
      (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX = pSVar6;
      (RHS->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX = pSVar5;
      uVar2 = (this->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size =
           (RHS->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      (RHS->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size = uVar2;
      uVar2 = (this->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity;
      (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Capacity =
           (RHS->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity;
      (RHS->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Capacity = uVar2;
    }
  }
  return;
}

Assistant:

void SmallVectorImpl<T>::swap(SmallVectorImpl<T> &RHS) {
  if (this == &RHS) return;

  // We can only avoid copying elements if neither vector is small.
  if (!this->isSmall() && !RHS.isSmall()) {
    std::swap(this->BeginX, RHS.BeginX);
    std::swap(this->Size, RHS.Size);
    std::swap(this->Capacity, RHS.Capacity);
    return;
  }
  if (RHS.size() > this->capacity())
    this->grow(RHS.size());
  if (this->size() > RHS.capacity())
    RHS.grow(this->size());

  // Swap the shared elements.
  size_t NumShared = this->size();
  if (NumShared > RHS.size()) NumShared = RHS.size();
  for (size_type i = 0; i != NumShared; ++i)
    std::swap((*this)[i], RHS[i]);

  // Copy over the extra elts.
  if (this->size() > RHS.size()) {
    size_t EltDiff = this->size() - RHS.size();
    this->uninitialized_copy(this->begin()+NumShared, this->end(), RHS.end());
    RHS.set_size(RHS.size() + EltDiff);
    this->destroy_range(this->begin()+NumShared, this->end());
    this->set_size(NumShared);
  } else if (RHS.size() > this->size()) {
    size_t EltDiff = RHS.size() - this->size();
    this->uninitialized_copy(RHS.begin()+NumShared, RHS.end(), this->end());
    this->set_size(this->size() + EltDiff);
    this->destroy_range(RHS.begin()+NumShared, RHS.end());
    RHS.set_size(NumShared);
  }
}